

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void __thiscall cs_impl::fiber::Routine::~Routine(Routine *this)

{
  _Manager_type p_Var1;
  process_context *__ptr;
  
  if (this->stack != (char *)0x0) {
    operator_delete__(this->stack);
  }
  p_Var1 = (this->func).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->func,(_Any_data *)&this->func,__destroy_functor);
  }
  cs::stack_type<cs::domain_type,_std::allocator>::destroy(&this->cs_stack);
  __ptr = (this->cs_pcontext)._M_t.
          super___uniq_ptr_impl<cs::process_context,_std::default_delete<cs::process_context>_>._M_t
          .super__Tuple_impl<0UL,_cs::process_context_*,_std::default_delete<cs::process_context>_>.
          super__Head_base<0UL,_cs::process_context_*,_false>._M_head_impl;
  if (__ptr != (process_context *)0x0) {
    std::default_delete<cs::process_context>::operator()
              ((default_delete<cs::process_context> *)&this->cs_pcontext,__ptr);
  }
  (this->cs_pcontext)._M_t.
  super___uniq_ptr_impl<cs::process_context,_std::default_delete<cs::process_context>_>._M_t.
  super__Tuple_impl<0UL,_cs::process_context_*,_std::default_delete<cs::process_context>_>.
  super__Head_base<0UL,_cs::process_context_*,_false>._M_head_impl = (process_context *)0x0;
  return;
}

Assistant:

~Routine()
			{
				delete[] stack;
			}